

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendFlags
          (cmLocalUnixMakefileGenerator3 *this,string *flags,string *newFlags)

{
  long lVar1;
  bool bVar2;
  string newf;
  string local_40;
  
  bVar2 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
  if ((bVar2) && (newFlags->_M_string_length != 0)) {
    std::__cxx11::string::string((string *)&local_40,(string *)newFlags);
    lVar1 = std::__cxx11::string::find((char *)&local_40,0x5e0e24);
    if (lVar1 != -1) {
      cmsys::SystemTools::ReplaceString(&local_40,"\\\"","\"");
      cmLocalGenerator::AppendFlags((cmLocalGenerator *)this,flags,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      return;
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  cmLocalGenerator::AppendFlags((cmLocalGenerator *)this,flags,newFlags);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendFlags(std::string& flags,
                                                const std::string& newFlags)
{
  if (this->IsWatcomWMake() && !newFlags.empty()) {
    std::string newf = newFlags;
    if (newf.find("\\\"") != std::string::npos) {
      cmSystemTools::ReplaceString(newf, "\\\"", "\"");
      this->cmLocalGenerator::AppendFlags(flags, newf);
      return;
    }
  }
  this->cmLocalGenerator::AppendFlags(flags, newFlags);
}